

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QFutureCallOutInterface_*>::reallocate
          (QPodArrayOps<QFutureCallOutInterface_*> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QFutureCallOutInterface_*>_*,_QFutureCallOutInterface_**> pVar1;
  
  pVar1 = QTypedArrayData<QFutureCallOutInterface_*>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QFutureCallOutInterface_*>).d,
                     (this->super_QArrayDataPointer<QFutureCallOutInterface_*>).ptr,alloc,option);
  if (pVar1.second != (QFutureCallOutInterface **)0x0) {
    (this->super_QArrayDataPointer<QFutureCallOutInterface_*>).d = pVar1.first;
    (this->super_QArrayDataPointer<QFutureCallOutInterface_*>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }